

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O3

int Gia_ManInseHighestScore(Gia_Man_t *p,int *pCost)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  int *__ptr;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  iVar7 = p->iData;
  lVar12 = (long)iVar7;
  __ptr = (int *)calloc(lVar12 << 6,4);
  iVar1 = p->nRegs;
  iVar9 = 0;
  iVar6 = 0;
  if (0 < (long)iVar1) {
    pVVar2 = p->vCos;
    iVar6 = pVVar2->nSize;
    lVar11 = 0;
    do {
      uVar4 = (iVar6 - iVar1) + (int)lVar11;
      if (((int)uVar4 < 0) || (iVar6 <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = pVVar2->pArray[uVar4];
      if ((iVar5 < 0) || (p->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (0 < iVar7) {
        iVar5 = iVar5 * iVar7 * 2;
        pvVar3 = p->pData;
        lVar13 = 0;
        do {
          uVar10 = *(ulong *)((long)pvVar3 + lVar13 * 8 + (long)iVar5 * 8);
          uVar8 = 0;
          do {
            uVar4 = 1;
            if ((uVar10 >> (uVar8 & 0x3f) & 1) == 0) {
              uVar4 = (uint)((*(ulong *)((long)pvVar3 + lVar13 * 8 + lVar12 * 8 + (long)iVar5 * 8) &
                             1L << ((byte)uVar8 & 0x3f)) != 0);
            }
            __ptr[(ulong)((uint)lVar13 & 0x3ffffff) * 0x40 + uVar8] =
                 __ptr[(ulong)((uint)lVar13 & 0x3ffffff) * 0x40 + uVar8] + uVar4;
            uVar8 = uVar8 + 1;
          } while (uVar8 != 0x40);
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar12);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar1);
    iVar6 = *__ptr;
  }
  if (0 < iVar7) {
    uVar10 = 0;
    uVar8 = 1;
    iVar7 = iVar6;
    do {
      iVar9 = __ptr[uVar8];
      iVar6 = iVar7;
      if (iVar7 <= iVar9) {
        iVar6 = iVar9;
      }
      if (iVar7 < iVar9) {
        uVar10 = uVar8 & 0xffffffff;
      }
      iVar9 = (int)uVar10;
      uVar8 = uVar8 + 1;
      iVar7 = iVar6;
    } while ((lVar12 << 6 & 0xffffffffU) != uVar8);
  }
  *pCost = iVar1 - iVar6;
  free(__ptr);
  return iVar9;
}

Assistant:

int Gia_ManInseHighestScore( Gia_Man_t * p, int * pCost )
{
    Gia_Obj_t * pObj;
    word * pData0, * pData1;
    int * pCounts, CountBest;
    int i, k, b, nPats, iPat;
    nPats = 64 * p->iData;
    pCounts = ABC_CALLOC( int, nPats );
    Gia_ManForEachRi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            for ( b = 0; b < 64; b++ )
                pCounts[64*i+b] += (((pData0[i] >> b) & 1) || ((pData1[i] >> b) & 1)); // binary
    }
    iPat = 0;
    CountBest = pCounts[0]; 
    for ( k = 1; k < nPats; k++ )
        if ( CountBest < pCounts[k] )
            CountBest = pCounts[k], iPat = k;
    *pCost = Gia_ManRegNum(p) - CountBest; // ternary
    ABC_FREE( pCounts );
    return iPat;
}